

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)77,unsigned_char,CPU::MC68000::ProcessorBase>
               (uint32_t source,uchar *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  uint uVar3;
  ulong uVar2;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 1;
  if (uVar3 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    bVar1 = *destination;
  }
  else {
    uVar2 = (ulong)((uint)*destination << ((byte)uVar3 - 1 & 0x1f) & 0x80);
    if (8 < uVar3) {
      uVar2 = 0;
    }
    status->extend_flag = uVar2;
    status->carry_flag = uVar2;
    status->overflow_flag = 0;
    uVar2 = (ulong)((uint)*destination << ((byte)uVar3 & 0x1f));
    if (7 < uVar3) {
      uVar2 = 0;
    }
    bVar1 = (byte)uVar2;
    *destination = bVar1;
  }
  status->zero_result = (ulong)bVar1;
  status->negative_flag = (ulong)(bVar1 & 0x80);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}